

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

void Fra_ClausEstimateCoverageOne(Fra_Sml_t *pSim,int *pLits,int nLits,int *pVar2Id,uint *pResult)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  long alStack_98 [3];
  uint *pSims [16];
  
  if (nLits < 1) {
    iVar3 = pSim->nWordsTotal;
  }
  else {
    iVar3 = pSim->nWordsTotal;
    uVar2 = 0;
    do {
      alStack_98[uVar2] = (long)&pSim[1].pAig + (long)pVar2Id[pLits[uVar2] >> 1] * (long)iVar3 * 4;
      uVar2 = uVar2 + 1;
    } while ((uint)nLits != uVar2);
  }
  if (0 < iVar3) {
    lVar1 = 0;
    do {
      pResult[lVar1] = 0xffffffff;
      if (0 < nLits) {
        uVar4 = 0xffffffff;
        uVar2 = 0;
        do {
          uVar4 = uVar4 & ((pLits[uVar2] & 1U) - 1 ^ *(uint *)(alStack_98[uVar2] + lVar1 * 4));
          pResult[lVar1] = uVar4;
          uVar2 = uVar2 + 1;
        } while ((uint)nLits != uVar2);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < pSim->nWordsTotal);
  }
  return;
}

Assistant:

void Fra_ClausEstimateCoverageOne( Fra_Sml_t * pSim, int * pLits, int nLits, int * pVar2Id, unsigned * pResult )
{
    unsigned * pSims[16];
    int iVar, i, w;
    for ( i = 0; i < nLits; i++ )
    {
        iVar = lit_var(pLits[i]);
        pSims[i] = Fra_ObjSim( pSim, pVar2Id[iVar] );
    }
    for ( w = 0; w < pSim->nWordsTotal; w++ )
    {
        pResult[w] = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            pResult[w] &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
    }
}